

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

void __thiscall
Variable_addDuplicateEquivalentVariablesAndCount_Test::TestBody
          (Variable_addDuplicateEquivalentVariablesAndCount_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_70 [8];
  Message local_68 [8];
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  size_t a;
  size_t e;
  undefined1 local_30 [8];
  VariablePtr v2;
  VariablePtr v1;
  Variable_addDuplicateEquivalentVariablesAndCount_Test *this_local;
  
  libcellml::Variable::create();
  libcellml::Variable::create();
  libcellml::Variable::addEquivalence
            ((shared_ptr *)
             &v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr *)local_30);
  libcellml::Variable::addEquivalence
            ((shared_ptr *)
             &v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr *)local_30);
  libcellml::Variable::addEquivalence
            ((shared_ptr *)local_30,
             (shared_ptr *)
             &v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Variable::addEquivalence
            ((shared_ptr *)local_30,
             (shared_ptr *)
             &v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  a = 1;
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       libcellml::Variable::equivalentVariableCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_60,"e","a",&a,(unsigned_long *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/connection/connection.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=(local_70,local_68);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_30);
  std::shared_ptr<libcellml::Variable>::~shared_ptr
            ((shared_ptr<libcellml::Variable> *)
             &v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Variable, addDuplicateEquivalentVariablesAndCount)
{
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    libcellml::Variable::addEquivalence(v1, v2);
    libcellml::Variable::addEquivalence(v1, v2);
    libcellml::Variable::addEquivalence(v2, v1);
    libcellml::Variable::addEquivalence(v2, v1);
    const size_t e = 1;
    size_t a = v1->equivalentVariableCount();
    EXPECT_EQ(e, a);
}